

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O0

size_t __thiscall wasm::StringifyHasher::operator()(StringifyHasher *this,Expression *curr)

{
  bool bVar1;
  size_t local_40;
  size_t local_38;
  StringifyHasher *local_30;
  size_t digest;
  If *iff;
  Expression *curr_local;
  StringifyHasher *this_local;
  
  iff = (If *)curr;
  curr_local = (Expression *)this;
  bVar1 = Properties::isControlFlowStructure(curr);
  if (bVar1) {
    digest = (size_t)Expression::dynCast<wasm::If>((Expression *)iff);
    if ((If *)digest == (If *)0x0) {
      this_local = (StringifyHasher *)ExpressionAnalyzer::hash((Expression *)iff);
    }
    else {
      local_30 = (StringifyHasher *)hash<wasm::Expression::Id>((Id *)digest);
      local_38 = ExpressionAnalyzer::hash(*(Expression **)(digest + 0x18));
      rehash<unsigned_long>((size_t *)&local_30,&local_38);
      if (*(long *)(digest + 0x20) != 0) {
        local_40 = ExpressionAnalyzer::hash(*(Expression **)(digest + 0x20));
        rehash<unsigned_long>((size_t *)&local_30,&local_40);
      }
      this_local = local_30;
    }
  }
  else {
    this_local = (StringifyHasher *)ExpressionAnalyzer::shallowHash((Expression *)iff);
  }
  return (size_t)this_local;
}

Assistant:

size_t StringifyHasher::operator()(Expression* curr) const {
  if (Properties::isControlFlowStructure(curr)) {
    if (auto* iff = curr->dynCast<If>()) {
      size_t digest = wasm::hash(iff->_id);
      rehash(digest, ExpressionAnalyzer::hash(iff->ifTrue));
      if (iff->ifFalse) {
        rehash(digest, ExpressionAnalyzer::hash(iff->ifFalse));
      }
      return digest;
    }

    return ExpressionAnalyzer::hash(curr);
  }

  return ExpressionAnalyzer::shallowHash(curr);
}